

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void arb1_texld(Context *ctx,char *opcode,int texldd)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  RegisterList *pRVar5;
  int *buflen;
  undefined4 in_register_00000014;
  size_t buflen_00;
  char *reason;
  char src3 [64];
  char src2 [64];
  char src0 [64];
  char dst [64];
  
  uVar1 = (ctx->dest_arg).result_mod;
  if (((uVar1 & 2) != 0) && (ctx->profile_supports_nv4 != 0)) {
    (ctx->dest_arg).result_mod = uVar1 & 0xfffffffd;
  }
  make_ARB1_destarg_string(ctx,dst,CONCAT44(in_register_00000014,texldd));
  iVar2 = shader_version_atleast(ctx,'\x01','\x04');
  buflen = &(ctx->dest_arg).regnum;
  piVar4 = &ctx->source_args[1].regnum;
  if (iVar2 == 0) {
    piVar4 = buflen;
  }
  uVar1 = *piVar4;
  pRVar5 = reglist_find(&ctx->samplers,REG_TYPE_SAMPLER,uVar1);
  if (iVar2 == 0) {
    get_ARB1_destarg_varname(ctx,src0,buflen_00);
  }
  else {
    get_ARB1_srcarg_varname(ctx,0,src0,(size_t)buflen);
  }
  src2[0x30] = '\0';
  src2[0x31] = '\0';
  src2[0x32] = '\0';
  src2[0x33] = '\0';
  src2[0x34] = '\0';
  src2[0x35] = '\0';
  src2[0x36] = '\0';
  src2[0x37] = '\0';
  src2[0x38] = '\0';
  src2[0x39] = '\0';
  src2[0x3a] = '\0';
  src2[0x3b] = '\0';
  src2[0x3c] = '\0';
  src2[0x3d] = '\0';
  src2[0x3e] = '\0';
  src2[0x3f] = '\0';
  src2[0x20] = '\0';
  src2[0x21] = '\0';
  src2[0x22] = '\0';
  src2[0x23] = '\0';
  src2[0x24] = '\0';
  src2[0x25] = '\0';
  src2[0x26] = '\0';
  src2[0x27] = '\0';
  src2[0x28] = '\0';
  src2[0x29] = '\0';
  src2[0x2a] = '\0';
  src2[0x2b] = '\0';
  src2[0x2c] = '\0';
  src2[0x2d] = '\0';
  src2[0x2e] = '\0';
  src2[0x2f] = '\0';
  src2[0x10] = '\0';
  src2[0x11] = '\0';
  src2[0x12] = '\0';
  src2[0x13] = '\0';
  src2[0x14] = '\0';
  src2[0x15] = '\0';
  src2[0x16] = '\0';
  src2[0x17] = '\0';
  src2[0x18] = '\0';
  src2[0x19] = '\0';
  src2[0x1a] = '\0';
  src2[0x1b] = '\0';
  src2[0x1c] = '\0';
  src2[0x1d] = '\0';
  src2[0x1e] = '\0';
  src2[0x1f] = '\0';
  src2[0] = '\0';
  src2[1] = '\0';
  src2[2] = '\0';
  src2[3] = '\0';
  src2[4] = '\0';
  src2[5] = '\0';
  src2[6] = '\0';
  src2[7] = '\0';
  src2[8] = '\0';
  src2[9] = '\0';
  src2[10] = '\0';
  src2[0xb] = '\0';
  src2[0xc] = '\0';
  src2[0xd] = '\0';
  src2[0xe] = '\0';
  src2[0xf] = '\0';
  src3[0x30] = '\0';
  src3[0x31] = '\0';
  src3[0x32] = '\0';
  src3[0x33] = '\0';
  src3[0x34] = '\0';
  src3[0x35] = '\0';
  src3[0x36] = '\0';
  src3[0x37] = '\0';
  src3[0x38] = '\0';
  src3[0x39] = '\0';
  src3[0x3a] = '\0';
  src3[0x3b] = '\0';
  src3[0x3c] = '\0';
  src3[0x3d] = '\0';
  src3[0x3e] = '\0';
  src3[0x3f] = '\0';
  src3[0x20] = '\0';
  src3[0x21] = '\0';
  src3[0x22] = '\0';
  src3[0x23] = '\0';
  src3[0x24] = '\0';
  src3[0x25] = '\0';
  src3[0x26] = '\0';
  src3[0x27] = '\0';
  src3[0x28] = '\0';
  src3[0x29] = '\0';
  src3[0x2a] = '\0';
  src3[0x2b] = '\0';
  src3[0x2c] = '\0';
  src3[0x2d] = '\0';
  src3[0x2e] = '\0';
  src3[0x2f] = '\0';
  src3[0x10] = '\0';
  src3[0x11] = '\0';
  src3[0x12] = '\0';
  src3[0x13] = '\0';
  src3[0x14] = '\0';
  src3[0x15] = '\0';
  src3[0x16] = '\0';
  src3[0x17] = '\0';
  src3[0x18] = '\0';
  src3[0x19] = '\0';
  src3[0x1a] = '\0';
  src3[0x1b] = '\0';
  src3[0x1c] = '\0';
  src3[0x1d] = '\0';
  src3[0x1e] = '\0';
  src3[0x1f] = '\0';
  src3[0] = '\0';
  src3[1] = '\0';
  src3[2] = '\0';
  src3[3] = '\0';
  src3[4] = '\0';
  src3[5] = '\0';
  src3[6] = '\0';
  src3[7] = '\0';
  src3[8] = '\0';
  src3[9] = '\0';
  src3[10] = '\0';
  src3[0xb] = '\0';
  src3[0xc] = '\0';
  src3[0xd] = '\0';
  src3[0xe] = '\0';
  src3[0xf] = '\0';
  if (texldd != 0) {
    make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 2,src2,(size_t)buflen);
    make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 3,src3,(size_t)buflen);
  }
  if (pRVar5 == (RegisterList *)0x0) {
    reason = "TEXLD using undeclared sampler";
  }
  else {
    if ((iVar2 != 0) && (ctx->source_args[1].swizzle != 0xe4)) {
      fail(ctx,"BUG: can\'t handle TEXLD with sampler swizzle at the moment");
    }
    uVar3 = pRVar5->index - 2;
    if (uVar3 < 3) {
      if (texldd != 0) {
        output_line(ctx,"%s%s, %s, %s, %s, texture[%d], %s;",opcode,dst,src0,src2,src3,(ulong)uVar1,
                    *(undefined8 *)(&DAT_00134db0 + (ulong)uVar3 * 8));
        return;
      }
      output_line(ctx,"%s%s, %s, texture[%d], %s;",opcode,dst,src0,(ulong)uVar1,
                  *(undefined8 *)(&DAT_00134db0 + (ulong)uVar3 * 8));
      return;
    }
    reason = "unknown texture type";
  }
  fail(ctx,reason);
  return;
}

Assistant:

static void arb1_texld(Context *ctx, const char *opcode, const int texldd)
{
    // !!! FIXME: Hack: "TEXH" is invalid in nv4. Fix this more cleanly.
    if ((ctx->dest_arg.result_mod & MOD_PP) && (support_nv4(ctx)))
        ctx->dest_arg.result_mod &= ~MOD_PP;

    char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));

    const int sm1 = !shader_version_atleast(ctx, 1, 4);
    const int regnum = sm1 ? ctx->dest_arg.regnum : ctx->source_args[1].regnum;
    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER, regnum);

    const char *ttype = NULL;
    char src0[64];
    if (sm1)
        get_ARB1_destarg_varname(ctx, src0, sizeof (src0));
    else
        get_ARB1_srcarg_varname(ctx, 0, src0, sizeof (src0));
    //char src1[64]; get_ARB1_srcarg_varname(ctx, 1, src1, sizeof (src1));  // !!! FIXME: SRC_MOD?

    char src2[64] = { 0 };
    char src3[64] = { 0 };

    if (texldd)
    {
        make_ARB1_srcarg_string(ctx, 2, src2, sizeof (src2));
        make_ARB1_srcarg_string(ctx, 3, src3, sizeof (src3));
    } // if

    // !!! FIXME: this should be in state_TEXLD, not in the arb1/glsl emitters.
    if (sreg == NULL)
    {
        fail(ctx, "TEXLD using undeclared sampler");
        return;
    } // if

    // SM1 only specifies dst, so don't check swizzle there.
    if ( !sm1 && (!no_swizzle(ctx->source_args[1].swizzle)) )
    {
        // !!! FIXME: does this ever actually happen?
        fail(ctx, "BUG: can't handle TEXLD with sampler swizzle at the moment");
    } // if

    switch ((const TextureType) sreg->index)
    {
        case TEXTURE_TYPE_2D: ttype = "2D"; break; // !!! FIXME: "RECT"?
        case TEXTURE_TYPE_CUBE: ttype = "CUBE"; break;
        case TEXTURE_TYPE_VOLUME: ttype = "3D"; break;
        default: fail(ctx, "unknown texture type"); return;
    } // switch

    if (texldd)
    {
        output_line(ctx, "%s%s, %s, %s, %s, texture[%d], %s;", opcode, dst,
                    src0, src2, src3, regnum, ttype);
    } // if
    else
    {
        output_line(ctx, "%s%s, %s, texture[%d], %s;", opcode, dst, src0,
                    regnum, ttype);
    } // else
}